

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::CompoundStmt> __thiscall
mocker::Parser::compoundStmt(Parser *this,TokIter *iter,TokIter end)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Token *this_01;
  size_t sVar1;
  size_t sVar2;
  TokenID TVar3;
  SyntaxError *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<mocker::ast::CompoundStmt> sVar5;
  Position beg;
  Position end_00;
  shared_ptr<mocker::ast::Statement> stmt;
  Position local_78;
  Position begPos;
  GetTokenID id;
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  stmts;
  
  Token::position(*end._M_current);
  begPos.line = (size_t)stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
  begPos.col = (size_t)stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
  TVar3 = GetTokenID::operator()(&id,*end._M_current);
  if (TVar3 == LeftBrace) {
    *(long *)end._M_current = *(long *)end._M_current + 0x38;
    stmts.
    super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    stmts.
    super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    stmts.
    super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = &stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    while( true ) {
      statement((Parser *)&stmt,iter,end);
      if (stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) break;
      std::
      vector<std::shared_ptr<mocker::ast::Statement>,std::allocator<std::shared_ptr<mocker::ast::Statement>>>
      ::emplace_back<std::shared_ptr<mocker::ast::Statement>>
                ((vector<std::shared_ptr<mocker::ast::Statement>,std::allocator<std::shared_ptr<mocker::ast::Statement>>>
                  *)&stmts,&stmt);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    TVar3 = GetTokenID::operator()(&id,*end._M_current);
    sVar2 = begPos.col;
    sVar1 = begPos.line;
    if (TVar3 != RightBrace) {
      this_02 = (SyntaxError *)__cxa_allocate_exception(0x48);
      Token::position(*end._M_current);
      SyntaxError::SyntaxError(this_02,&begPos,&local_78);
      __cxa_throw(this_02,&SyntaxError::typeinfo,CompileError::~CompileError);
    }
    this_01 = *end._M_current;
    *(Token **)end._M_current = this_01 + 1;
    Token::position(this_01);
    beg.col = sVar1;
    beg.line = (size_t)iter;
    end_00.col = local_78.line;
    end_00.line = sVar2;
    makeNode<mocker::ast::CompoundStmt,std::vector<std::shared_ptr<mocker::ast::Statement>,std::allocator<std::shared_ptr<mocker::ast::Statement>>>>
              (this,beg,end_00,
               (vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
                *)local_78.col);
    std::
    vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
    ::~vector(&stmts);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    _Var4._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var4._M_pi;
  sVar5.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::CompoundStmt>)
         sVar5.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::CompoundStmt> Parser::compoundStmt(TokIter &iter,
                                                        TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  if (id(iter) != TokenID::LeftBrace)
    return nullptr;
  ++iter;
  std::vector<std::shared_ptr<ast::Statement>> stmts;
  while (auto stmt = statement(iter, end))
    stmts.emplace_back(std::move(stmt));
  if (id(iter) != TokenID::RightBrace)
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::CompoundStmt>(begPos, (iter++)->position().second,
                                     std::move(stmts));
}